

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ClockingDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingDeclarationSyntax,slang::syntax::ClockingDeclarationSyntax_const&>
          (BumpAllocator *this,ClockingDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ClockingDeclarationSyntax *pCVar8;
  long lVar9;
  Token *pTVar10;
  Token *pTVar11;
  byte bVar12;
  
  bVar12 = 0;
  pCVar8 = (ClockingDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClockingDeclarationSyntax *)this->endPtr < pCVar8 + 1) {
    pCVar8 = (ClockingDeclarationSyntax *)allocateSlow(this,0xf8,8);
  }
  else {
    this->head->current = (byte *)(pCVar8 + 1);
  }
  (pCVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005bad98;
  pTVar10 = &args->globalOrDefault;
  pTVar11 = &pCVar8->globalOrDefault;
  for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
    uVar5 = pTVar10->field_0x2;
    NVar6.raw = (pTVar10->numFlags).raw;
    uVar7 = pTVar10->rawLen;
    pTVar11->kind = pTVar10->kind;
    pTVar11->field_0x2 = uVar5;
    pTVar11->numFlags = (NumericTokenFlags)NVar6.raw;
    pTVar11->rawLen = uVar7;
    pTVar10 = (Token *)&pTVar10[-(ulong)bVar12].info;
    pTVar11 = (Token *)&pTVar11[-(ulong)bVar12].info;
  }
  (pCVar8->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar8->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar8->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (pCVar8->items).super_SyntaxListBase.childCount = (args->items).super_SyntaxListBase.childCount;
  sVar2 = (args->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar8->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar8->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar8->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005bae20;
  uVar5 = (args->endClocking).field_0x2;
  NVar6.raw = (args->endClocking).numFlags.raw;
  uVar7 = (args->endClocking).rawLen;
  pIVar3 = (args->endClocking).info;
  (pCVar8->endClocking).kind = (args->endClocking).kind;
  (pCVar8->endClocking).field_0x2 = uVar5;
  (pCVar8->endClocking).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar8->endClocking).rawLen = uVar7;
  (pCVar8->endClocking).info = pIVar3;
  pCVar8->endBlockName = args->endBlockName;
  return pCVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }